

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void puzzle_Generator(int row,int col,int games)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  Board *pBVar5;
  Manager local_b0;
  Manager local_98;
  Board local_70;
  int local_34;
  undefined1 local_30 [4];
  int vec;
  Manager manager;
  int games_local;
  int col_local;
  int row_local;
  
  manager.puzzles.super__Vector_base<Board,_std::allocator<Board>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = games;
  Manager::Manager((Manager *)local_30,row,col,games);
  for (local_34 = 0; uVar2 = (ulong)local_34,
      sVar3 = std::vector<Board,_std::allocator<Board>_>::size
                        ((vector<Board,_std::allocator<Board>_> *)local_30), uVar2 < sVar3;
      local_34 = local_34 + 1) {
    if (0 < local_34) {
      pvVar4 = std::vector<Board,_std::allocator<Board>_>::operator[]
                         ((vector<Board,_std::allocator<Board>_> *)local_30,(long)local_34);
      Board::Board(&local_70,pvVar4);
      bVar1 = verify_Board((vector<Board,_std::allocator<Board>_> *)local_30,&local_70,local_34);
      Board::~Board(&local_70);
      if (bVar1) {
        local_34 = local_34 + -2;
      }
    }
    pvVar4 = std::vector<Board,_std::allocator<Board>_>::operator[]
                       ((vector<Board,_std::allocator<Board>_> *)local_30,(long)local_34);
    pBVar5 = create_Board(pvVar4,row,col);
    pvVar4 = std::vector<Board,_std::allocator<Board>_>::operator[]
                       ((vector<Board,_std::allocator<Board>_> *)local_30,(long)local_34);
    Board::operator=(pvVar4,pBVar5);
  }
  Manager::Manager(&local_98,(Manager *)local_30);
  writeBPMatrix(&local_98,
                manager.puzzles.super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_,row,col);
  Manager::~Manager(&local_98);
  Manager::Manager(&local_b0,(Manager *)local_30);
  writeBPArmada(&local_b0,
                manager.puzzles.super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_);
  Manager::~Manager(&local_b0);
  Manager::~Manager((Manager *)local_30);
  return;
}

Assistant:

void puzzle_Generator( int row, int col, int games )
{
   Manager manager( row, col, games);

   for( int vec = 0; vec < manager.puzzles.size(); vec++ )
   {
      if( vec > 0 )
      {
          if( verify_Board( manager.puzzles, manager.puzzles[vec] , vec ) )
          {
              vec = vec - 2;
          }
      }

      manager.puzzles[vec] = *create_Board( &manager.puzzles[vec], row, col );
   }

   writeBPMatrix( manager, games, row, col );
   writeBPArmada( manager, games );
}